

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3DbStrNDup(sqlite3 *db,char *z,u64 n)

{
  sqlite3 *in_RDX;
  void *in_RSI;
  char *zNew;
  char *local_28;
  
  if (in_RSI == (void *)0x0) {
    local_28 = (char *)0x0;
  }
  else {
    local_28 = (char *)sqlite3DbMallocRawNN(in_RDX,0xaaaaaaaaaaaaaaaa);
  }
  if (local_28 != (char *)0x0) {
    memcpy(local_28,in_RSI,(size_t)in_RDX);
    local_28[(long)in_RDX] = '\0';
  }
  return local_28;
}

Assistant:

SQLITE_PRIVATE char *sqlite3DbStrNDup(sqlite3 *db, const char *z, u64 n){
  char *zNew;
  assert( db!=0 );
  assert( z!=0 || n==0 );
  assert( (n&0x7fffffff)==n );
  zNew = z ? sqlite3DbMallocRawNN(db, n+1) : 0;
  if( zNew ){
    memcpy(zNew, z, (size_t)n);
    zNew[n] = 0;
  }
  return zNew;
}